

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O3

int xmlMemSetup(xmlFreeFunc freeFunc,xmlMallocFunc mallocFunc,xmlReallocFunc reallocFunc,
               xmlStrdupFunc strdupFunc)

{
  undefined4 in_R8D;
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_4_ = -(uint)(freeFunc == (xmlFreeFunc)0x0);
  auVar2._4_4_ = -(uint)(mallocFunc == (xmlMallocFunc)0x0);
  auVar2._8_4_ = -(uint)(reallocFunc == (xmlReallocFunc)0x0);
  auVar2._12_4_ = -(uint)(strdupFunc == (xmlStrdupFunc)0x0);
  iVar1 = movmskps(in_R8D,auVar2);
  if (iVar1 != 0) {
    return -1;
  }
  xmlFree = freeFunc;
  xmlMalloc = mallocFunc;
  xmlMallocAtomic = mallocFunc;
  xmlRealloc = reallocFunc;
  xmlMemStrdup = strdupFunc;
  return 0;
}

Assistant:

int
xmlMemSetup(xmlFreeFunc freeFunc, xmlMallocFunc mallocFunc,
            xmlReallocFunc reallocFunc, xmlStrdupFunc strdupFunc) {
    if (freeFunc == NULL)
	return(-1);
    if (mallocFunc == NULL)
	return(-1);
    if (reallocFunc == NULL)
	return(-1);
    if (strdupFunc == NULL)
	return(-1);
    xmlFree = freeFunc;
    xmlMalloc = mallocFunc;
    xmlMallocAtomic = mallocFunc;
    xmlRealloc = reallocFunc;
    xmlMemStrdup = strdupFunc;
    return(0);
}